

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

bool __thiscall ftxui::VerticalContainer::EventHandler(VerticalContainer *this,Event *event)

{
  int iVar1;
  int *piVar2;
  __type _Var3;
  int iVar4;
  int iVar5;
  string *__lhs;
  Event EStack_68;
  
  iVar1 = *(this->super_ContainerBase).selector_;
  __lhs = &event->input_;
  _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::ArrowUp + 0x18));
  if (_Var3) {
LAB_001307aa:
    ftxui::ContainerBase::MoveSelector(&this->super_ContainerBase,-1);
  }
  else {
    Event::Character(&EStack_68,'k');
    _Var3 = std::operator==(__lhs,&EStack_68.input_);
    std::__cxx11::string::~string((string *)&EStack_68.input_);
    if (_Var3) goto LAB_001307aa;
  }
  _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::ArrowDown + 0x18));
  if (!_Var3) {
    Event::Character(&EStack_68,'j');
    _Var3 = std::operator==(__lhs,&EStack_68.input_);
    std::__cxx11::string::~string((string *)&EStack_68.input_);
    if (!_Var3) goto LAB_00130801;
  }
  ftxui::ContainerBase::MoveSelector(&this->super_ContainerBase,1);
LAB_00130801:
  _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::Tab + 0x18));
  if ((_Var3) &&
     ((this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    ftxui::ContainerBase::MoveSelectorWrap(&this->super_ContainerBase,1);
  }
  _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::TabReverse + 0x18));
  if ((_Var3) &&
     ((this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    ftxui::ContainerBase::MoveSelectorWrap(&this->super_ContainerBase,-1);
  }
  piVar2 = (this->super_ContainerBase).selector_;
  iVar4 = (int)((ulong)((long)(this->super_ContainerBase).super_ComponentBase.children_.
                              super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_ContainerBase).super_ComponentBase.children_.
                             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
  iVar5 = *piVar2;
  if (iVar5 < iVar4) {
    iVar4 = iVar5;
  }
  iVar5 = 0;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  *piVar2 = iVar5;
  return iVar1 != iVar5;
}

Assistant:

bool EventHandler(Event event) override {
    int old_selected = *selector_;
    if (event == Event::ArrowUp || event == Event::Character('k'))
      MoveSelector(-1);
    if (event == Event::ArrowDown || event == Event::Character('j'))
      MoveSelector(+1);
    if (event == Event::Tab && children_.size())
      MoveSelectorWrap(+1);
    if (event == Event::TabReverse && children_.size())
      MoveSelectorWrap(-1);

    *selector_ = std::max(0, std::min(int(children_.size()) - 1, *selector_));
    return old_selected != *selector_;
  }